

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool ON_StandardDisplayModeId::IsStandardDisplayModeId(ON_UUID id)

{
  bool bVar1;
  bool bVar2;
  ON_UUID_struct local_18;
  
  bVar1 = ::operator==(&Wireframe,&local_18);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = ::operator==(&Shaded,&local_18);
    if (!bVar1) {
      bVar1 = ::operator==(&Rendered,&local_18);
      if (!bVar1) {
        bVar1 = ::operator==(&Ghosted,&local_18);
        if (!bVar1) {
          bVar1 = ::operator==(&XrayShade,&local_18);
          if (!bVar1) {
            bVar1 = ::operator==(&RenderedShadows,&local_18);
            if (!bVar1) {
              bVar1 = ::operator==(&Technical,&local_18);
              if (!bVar1) {
                bVar1 = ::operator==(&Artistic,&local_18);
                if (!bVar1) {
                  bVar1 = ::operator==(&Pen,&local_18);
                  if (!bVar1) {
                    bVar1 = ::operator==(&Monochrome,&local_18);
                    if (!bVar1) {
                      bVar1 = ::operator==(&AmbientOcclusion,&local_18);
                      if (!bVar1) {
                        bVar2 = ::operator==(&Raytraced,&local_18);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_StandardDisplayModeId::IsStandardDisplayModeId(
    ON_UUID id
    )
{
  if ( ON_StandardDisplayModeId::Wireframe == id )
    return true;
  if ( ON_StandardDisplayModeId::Shaded == id )
    return true;
  if ( ON_StandardDisplayModeId::Rendered == id )
    return true;
  if ( ON_StandardDisplayModeId::Ghosted == id )
    return true;
  if ( ON_StandardDisplayModeId::XrayShade == id )
    return true;
  if ( ON_StandardDisplayModeId::RenderedShadows == id )
    return true;
  if ( ON_StandardDisplayModeId::Technical == id )
    return true;
  if ( ON_StandardDisplayModeId::Artistic == id )
    return true;
  if ( ON_StandardDisplayModeId::Pen == id )
    return true;
  if (ON_StandardDisplayModeId::Monochrome == id)
    return true;
  if ( ON_StandardDisplayModeId::AmbientOcclusion == id)
    return true;
  if ( ON_StandardDisplayModeId::Raytraced == id)
    return true;

  return false;
}